

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleDateFormat::compareSimpleAffix
          (SimpleDateFormat *this,UnicodeString *affix,UnicodeString *input,int32_t pos)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  UBool UVar4;
  uint c;
  uint uVar5;
  int iVar6;
  int32_t pos_00;
  int32_t offset;
  int iVar7;
  SimpleDateFormat *this_00;
  int32_t iVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  
  offset = 0;
  iVar10 = pos;
  while( true ) {
    sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (affix->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    iVar11 = iVar10;
    if (iVar8 <= offset) break;
    c = icu_63::UnicodeString::char32At(affix,offset);
    iVar7 = 2 - (uint)(c < 0x10000);
    UVar4 = PatternProps::isWhiteSpace(c);
    if (UVar4 == '\0') {
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar9 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar9 = (int)sVar1 >> 5;
      }
      if ((iVar9 <= iVar10) || (uVar5 = icu_63::UnicodeString::char32At(input,iVar10), uVar5 != c))
      break;
      offset = offset + iVar7;
      iVar10 = iVar10 + iVar7;
    }
    else {
      iVar9 = offset;
      bVar3 = false;
      do {
        bVar2 = bVar3;
        sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (input->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        this_00 = (SimpleDateFormat *)input;
        iVar11 = iVar10;
        if ((iVar6 <= iVar10) || (uVar5 = icu_63::UnicodeString::char32At(input,iVar10), uVar5 != c)
           ) break;
        sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (affix->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        iVar9 = iVar9 + iVar7;
        iVar10 = iVar10 + iVar7;
        iVar11 = iVar10;
        if (iVar9 == iVar6) {
          bVar2 = true;
          break;
        }
        c = icu_63::UnicodeString::char32At(affix,iVar9);
        iVar7 = 2 - (uint)(c < 0x10000);
        this_00 = (SimpleDateFormat *)(ulong)c;
        UVar4 = PatternProps::isWhiteSpace(c);
        bVar2 = true;
        bVar3 = true;
      } while (UVar4 != '\0');
      pos_00 = skipPatternWhiteSpace(this_00,affix,iVar9);
      iVar10 = skipUWhiteSpace(this_00,input,iVar11);
      if ((!bVar2) && (iVar10 == iVar11)) break;
      offset = skipUWhiteSpace(this_00,affix,pos_00);
    }
  }
  iVar10 = -1;
  if (iVar8 <= offset) {
    iVar10 = iVar11 - pos;
  }
  return iVar10;
}

Assistant:

int32_t
SimpleDateFormat::compareSimpleAffix(const UnicodeString& affix,
                   const UnicodeString& input,
                   int32_t pos) const {
    int32_t start = pos;
    for (int32_t i=0; i<affix.length(); ) {
        UChar32 c = affix.char32At(i);
        int32_t len = U16_LENGTH(c);
        if (PatternProps::isWhiteSpace(c)) {
            // We may have a pattern like: \u200F \u0020
            //        and input text like: \u200F \u0020
            // Note that U+200F and U+0020 are Pattern_White_Space but only
            // U+0020 is UWhiteSpace.  So we have to first do a direct
            // match of the run of Pattern_White_Space in the pattern,
            // then match any extra characters.
            UBool literalMatch = FALSE;
            while (pos < input.length() &&
                   input.char32At(pos) == c) {
                literalMatch = TRUE;
                i += len;
                pos += len;
                if (i == affix.length()) {
                    break;
                }
                c = affix.char32At(i);
                len = U16_LENGTH(c);
                if (!PatternProps::isWhiteSpace(c)) {
                    break;
                }
            }

            // Advance over run in pattern
            i = skipPatternWhiteSpace(affix, i);

            // Advance over run in input text
            // Must see at least one white space char in input,
            // unless we've already matched some characters literally.
            int32_t s = pos;
            pos = skipUWhiteSpace(input, pos);
            if (pos == s && !literalMatch) {
                return -1;
            }

            // If we skip UWhiteSpace in the input text, we need to skip it in the pattern.
            // Otherwise, the previous lines may have skipped over text (such as U+00A0) that
            // is also in the affix.
            i = skipUWhiteSpace(affix, i);
        } else {
            if (pos < input.length() &&
                input.char32At(pos) == c) {
                i += len;
                pos += len;
            } else {
                return -1;
            }
        }
    }
    return pos - start;
}